

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::begin_array
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RDX;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  basic_json_parser<char,_std::allocator<char>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  parse_state in_stack_ffffffffffffffdf;
  semantic_tag tag;
  
  iVar2 = in_RDI->level_ + 1;
  in_RDI->level_ = iVar2;
  if (in_RDI->max_nesting_depth_ < iVar2) {
    bVar1 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                      (in_RSI,(json_errc)((ulong)in_RDX >> 0x20),&in_RDI->super_ser_context);
    in_RDI->more_ = bVar1;
    if ((in_RDI->more_ & 1U) == 0) {
      std::error_code::operator=((error_code *)in_RSI,(json_errc)((ulong)in_RDX >> 0x20));
      return;
    }
  }
  tag = (semantic_tag)((ulong)in_RDX >> 0x38);
  push_state(in_RDI,in_stack_ffffffffffffffdf);
  in_RDI->state_ = expect_value_or_end;
  basic_json_visitor<char>::begin_array
            ((basic_json_visitor<char> *)in_RSI,tag,&in_RDI->super_ser_context,
             (error_code *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
  return;
}

Assistant:

void begin_array(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (++level_ > max_nesting_depth_)
        {
            more_ = err_handler_(json_errc::max_nesting_depth_exceeded, *this);
            if (!more_)
            {
                ec = json_errc::max_nesting_depth_exceeded;
                return;
            }
        }

        push_state(parse_state::array);
        state_ = parse_state::expect_value_or_end;
        visitor.begin_array(semantic_tag::none, *this, ec);

        more_ = !cursor_mode_;
    }